

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::FreeColSingletonPS::FreeColSingletonPS
          (FreeColSingletonPS *this,FreeColSingletonPS *old)

{
  undefined8 uVar1;
  long in_RSI;
  PostStep *in_RDI;
  PostStep *in_stack_ffffffffffffffe0;
  
  PostStep::PostStep(in_stack_ffffffffffffffe0,in_RDI);
  in_RDI->_vptr_PostStep = (_func_int **)&PTR__FreeColSingletonPS_004ed208;
  *(undefined4 *)&in_RDI[1]._vptr_PostStep = *(undefined4 *)(in_RSI + 0x28);
  *(undefined4 *)((long)&in_RDI[1]._vptr_PostStep + 4) = *(undefined4 *)(in_RSI + 0x2c);
  *(undefined4 *)&in_RDI[1].m_name = *(undefined4 *)(in_RSI + 0x30);
  *(undefined4 *)((long)&in_RDI[1].m_name + 4) = *(undefined4 *)(in_RSI + 0x34);
  uVar1 = *(undefined8 *)(in_RSI + 0x38);
  in_RDI[1].nCols = (int)uVar1;
  in_RDI[1].nRows = (int)((ulong)uVar1 >> 0x20);
  in_RDI[1]._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(in_RSI + 0x40);
  *(byte *)&in_RDI[1]._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = *(byte *)(in_RSI + 0x48) & 1;
  *(byte *)((long)&in_RDI[1]._tolerances.
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi + 1) = *(byte *)(in_RSI + 0x49) & 1;
  DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)in_stack_ffffffffffffffe0,(DSVectorBase<double> *)in_RDI);
  return;
}

Assistant:

FreeColSingletonPS(const FreeColSingletonPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_i(old.m_i)
         , m_old_j(old.m_old_j)
         , m_old_i(old.m_old_i)
         , m_obj(old.m_obj)
         , m_lRhs(old.m_lRhs)
         , m_onLhs(old.m_onLhs)
         , m_eqCons(old.m_eqCons)
         , m_row(old.m_row)
      {}